

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O1

void __thiscall
KDReports::AutoTableElement::AutoTableElement(AutoTableElement *this,AutoTableElement *other)

{
  AutoTableElementPrivate *pAVar1;
  int *piVar2;
  bool bVar3;
  AutoTableElementPrivate *pAVar4;
  
  AbstractTableElement::AbstractTableElement
            (&this->super_AbstractTableElement,&other->super_AbstractTableElement);
  (this->super_AbstractTableElement).super_Element._vptr_Element =
       (_func_int **)&PTR__AutoTableElement_00174298;
  pAVar4 = (AutoTableElementPrivate *)operator_new(0x78);
  pAVar1 = (other->d)._M_t.
           super___uniq_ptr_impl<KDReports::AutoTableElementPrivate,_std::default_delete<KDReports::AutoTableElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::AutoTableElementPrivate_*,_std::default_delete<KDReports::AutoTableElementPrivate>_>
           .super__Head_base<0UL,_KDReports::AutoTableElementPrivate_*,_false>._M_head_impl;
  pAVar4->m_tableModel = pAVar1->m_tableModel;
  piVar2 = (int *)(pAVar1->m_modelKey).d.d;
  (pAVar4->m_modelKey).d.d = (Data *)piVar2;
  *(char16_t **)((long)&(pAVar4->m_modelKey).d + 8) =
       *(char16_t **)((long)&(pAVar1->m_modelKey).d + 8);
  *(qsizetype *)((long)&(pAVar4->m_modelKey).d + 0x10) =
       *(qsizetype *)((long)&(pAVar1->m_modelKey).d + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  bVar3 = pAVar1->m_horizontalHeaderVisible;
  pAVar4->m_verticalHeaderVisible = pAVar1->m_verticalHeaderVisible;
  pAVar4->m_horizontalHeaderVisible = bVar3;
  QBrush::QBrush(&pAVar4->m_headerBackground,&pAVar1->m_headerBackground);
  pAVar4->m_iconSize = pAVar1->m_iconSize;
  std::function<void_(int,_QTextTableCellFormat_&)>::function
            (&pAVar4->m_horizontalHeaderFormatFunc,&pAVar1->m_horizontalHeaderFormatFunc);
  std::function<void_(int,_QTextTableCellFormat_&)>::function
            (&pAVar4->m_verticalHeaderFormatFunc,&pAVar1->m_verticalHeaderFormatFunc);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::AutoTableElementPrivate,_std::default_delete<KDReports::AutoTableElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::AutoTableElementPrivate_*,_std::default_delete<KDReports::AutoTableElementPrivate>_>
  .super__Head_base<0UL,_KDReports::AutoTableElementPrivate_*,_false>._M_head_impl = pAVar4;
  return;
}

Assistant:

KDReports::AutoTableElement::AutoTableElement(const AutoTableElement &other)
    : AbstractTableElement(other)
    , d(new AutoTableElementPrivate(*other.d))
{
}